

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_inlines_b.h
# Opt level: O3

void arena_dalloc_no_tcache(tsdn_t *tsdn,void *ptr)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  rtree_leaf_elm_t *prVar4;
  undefined8 uVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  rtree_leaf_elm_t *prVar8;
  rtree_leaf_elm_t *extraout_RDX;
  long lVar9;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_198;
  
  rtree_ctx = &rStack_198;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_198);
  }
  else {
    rtree_ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  prVar6 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar7 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar7);
  prVar8 = *(rtree_leaf_elm_t **)((long)&rtree_ctx->cache[0].leafkey + uVar7);
  if (prVar8 == prVar6) {
    prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if ((rtree_leaf_elm_t *)rtree_ctx->l2_cache[0].leafkey == prVar6) {
    prVar4 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = (uintptr_t)prVar8;
    prVar8 = (rtree_leaf_elm_t *)puVar1[1];
    rtree_ctx->l2_cache[0].leaf = prVar8;
    *puVar1 = (ulong)prVar6;
    puVar1[1] = (ulong)prVar4;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar4->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar9 = 0x118;
    do {
      if (*(rtree_leaf_elm_t **)((long)rtree_ctx->cache + lVar9 + -8) == prVar6) {
        uVar7 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar9);
        puVar2 = (undefined8 *)((long)rtree_ctx->cache + lVar9 + -0x18);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)rtree_ctx->cache + lVar9 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        *(rtree_leaf_elm_t **)((long)rtree_ctx->cache + lVar9 + -0x18) = prVar8;
        prVar8 = (rtree_leaf_elm_t *)puVar1[1];
        *(rtree_leaf_elm_t **)((long)(rtree_ctx->cache + -1) + lVar9) = prVar8;
        *puVar1 = (ulong)prVar6;
        puVar1[1] = uVar7;
        prVar6 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar7);
        goto LAB_0118a5ac;
      }
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x188);
    prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard
                       (tsdn,&duckdb_je_arena_emap_global.rtree,rtree_ctx,(uintptr_t)ptr,true,false)
    ;
    prVar8 = extraout_RDX;
  }
LAB_0118a5ac:
  if (((ulong)(prVar6->le_bits).repr & 1) == 0) {
    arena_dalloc_large_no_tcache(tsdn,ptr,(szind_t)prVar8);
  }
  else {
    duckdb_je_arena_dalloc_small(tsdn,ptr);
  }
  return;
}

Assistant:

static inline void
arena_dalloc_no_tcache(tsdn_t *tsdn, void *ptr) {
	assert(ptr != NULL);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsdn, &arena_emap_global, ptr, &alloc_ctx);

	if (config_debug) {
		edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global,
		    ptr);
		assert(alloc_ctx.szind == edata_szind_get(edata));
		assert(alloc_ctx.szind < SC_NSIZES);
		assert(alloc_ctx.slab == edata_slab_get(edata));
	}

	if (likely(alloc_ctx.slab)) {
		/* Small allocation. */
		arena_dalloc_small(tsdn, ptr);
	} else {
		arena_dalloc_large_no_tcache(tsdn, ptr, alloc_ctx.szind);
	}
}